

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_abs<float>(uint length)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  float fVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int iVar19;
  ulong uVar20;
  undefined8 *puVar21;
  long lVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  uint uVar24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  shared_ptr<float> pv;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  
  iVar19 = posix_memalign(&pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0x40,(long)(int)length << 2);
  _Var25 = pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (iVar19 != 0) {
    _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,_Var25._M_pi,sse::common::free<float>
            );
  if (0 < (int)length) {
    lVar22 = 0;
    p_Var23 = _Var25._M_pi;
    do {
      *(float *)&p_Var23->_vptr__Sp_counted_base = (float)(int)lVar22;
      lVar22 = lVar22 + -1;
      p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var23->_vptr__Sp_counted_base + 4);
    } while (-lVar22 != (ulong)length);
  }
  p_Var23 = _Var25._M_pi;
  uVar26 = length;
  uVar24 = length;
  if (7 < (int)length) {
    do {
      uVar26 = *(uint *)&p_Var23->_vptr__Sp_counted_base;
      uVar28 = *(uint *)((long)&p_Var23->_vptr__Sp_counted_base + 4);
      uVar6 = p_Var23->_M_use_count;
      uVar8 = p_Var23->_M_weak_count;
      p_Var1 = p_Var23 + 1;
      local_48 = *(uint *)&p_Var1->_vptr__Sp_counted_base;
      uStack_44 = *(uint *)((long)&p_Var23[1]._vptr__Sp_counted_base + 4);
      uVar11 = p_Var1->_vptr__Sp_counted_base;
      uVar12 = p_Var1->_M_use_count;
      uVar10 = p_Var23[1]._M_weak_count;
      uVar27 = p_Var23[1]._M_use_count;
      if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
        test_abs<float>();
        local_48 = (uint)uVar11;
        uStack_44 = (uint)((ulong)uVar11 >> 0x20);
        uVar27 = uVar12;
      }
      uVar18 = sse::internals::abs_ps(float(int))::sign_mask._12_4_;
      uVar17 = sse::internals::abs_ps(float(int))::sign_mask._8_4_;
      uVar16 = sse::internals::abs_ps(float(int))::sign_mask._4_4_;
      uVar15 = sse::internals::abs_ps(float(int))::sign_mask._0_4_;
      if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
        test_abs<float>();
      }
      uVar4 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_;
      uVar5 = ~sse::internals::abs_ps(float(int))::sign_mask._4_4_;
      uVar7 = ~sse::internals::abs_ps(float(int))::sign_mask._8_4_;
      uVar9 = ~sse::internals::abs_ps(float(int))::sign_mask._12_4_;
      *(uint *)&p_Var23->_vptr__Sp_counted_base = ~uVar15 & uVar26;
      *(uint *)((long)&p_Var23->_vptr__Sp_counted_base + 4) = ~uVar16 & uVar28;
      p_Var23->_M_use_count = ~uVar17 & uVar6;
      p_Var23->_M_weak_count = ~uVar18 & uVar8;
      *(uint *)&p_Var23[1]._vptr__Sp_counted_base = uVar4 & local_48;
      *(uint *)((long)&p_Var23[1]._vptr__Sp_counted_base + 4) = uVar5 & uStack_44;
      p_Var23[1]._M_use_count = uVar7 & uVar27;
      p_Var23[1]._M_weak_count = uVar9 & uVar10;
      uVar26 = uVar24 - 8;
      p_Var23 = p_Var23 + 2;
      bVar3 = 0xf < (int)uVar24;
      uVar24 = uVar26;
    } while (bVar3);
  }
  if (3 < (int)uVar26) {
    local_48 = *(uint *)&p_Var23->_vptr__Sp_counted_base;
    uStack_44 = *(uint *)((long)&p_Var23->_vptr__Sp_counted_base + 4);
    uVar13 = p_Var23->_vptr__Sp_counted_base;
    uVar14 = p_Var23->_M_use_count;
    uVar24 = p_Var23->_M_weak_count;
    uVar28 = p_Var23->_M_use_count;
    if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
      test_abs<float>();
      local_48 = (uint)uVar13;
      uStack_44 = (uint)((ulong)uVar13 >> 0x20);
      uVar28 = uVar14;
    }
    uVar6 = ~sse::internals::abs_ps(float(int))::sign_mask._4_4_;
    uVar8 = ~sse::internals::abs_ps(float(int))::sign_mask._8_4_;
    uVar10 = ~sse::internals::abs_ps(float(int))::sign_mask._12_4_;
    *(uint *)&p_Var23->_vptr__Sp_counted_base =
         ~sse::internals::abs_ps(float(int))::sign_mask._0_4_ & local_48;
    *(uint *)((long)&p_Var23->_vptr__Sp_counted_base + 4) = uVar6 & uStack_44;
    p_Var23->_M_use_count = uVar8 & uVar28;
    p_Var23->_M_weak_count = uVar10 & uVar24;
    uVar26 = uVar26 - 4;
    p_Var23 = p_Var23 + 1;
  }
  if (0 < (int)uVar26) {
    iVar19 = uVar26 + 1;
    lVar22 = 0;
    do {
      uVar26 = *(uint *)((long)&p_Var23->_vptr__Sp_counted_base + lVar22);
      if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
        test_abs<float>();
      }
      *(uint *)((long)&p_Var23->_vptr__Sp_counted_base + lVar22) =
           ~sse::internals::abs_ps(float(int))::sign_mask._0_4_ & uVar26;
      lVar22 = lVar22 + 4;
      iVar19 = iVar19 + -1;
    } while (1 < iVar19);
  }
  if (0 < (int)length) {
    uVar20 = 0;
    do {
      fVar2 = *(float *)((long)&(_Var25._M_pi)->_vptr__Sp_counted_base + uVar20 * 4);
      if ((fVar2 < 0.0) && ((fVar2 != 1.1754944e-38 || (NAN(fVar2))))) {
        puVar21 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar21 = "void test_abs(unsigned int) [T = float]";
        *(undefined4 *)(puVar21 + 1) = 0x81;
        *(uint *)((long)puVar21 + 0xc) = length;
        __cxa_throw(puVar21,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (length != uVar20);
  }
  if (pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}